

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv.cc
# Opt level: O0

bool absl::anon_unknown_0::MustRoundUp
               (uint64_t guess_mantissa,int guess_exponent,ParsedFloat *parsed_decimal)

{
  int iVar1;
  int in_ESI;
  long in_RDI;
  BigUnsigned<84> rhs_1;
  BigUnsigned<84> rhs;
  int comparison;
  BigUnsigned<84> *lhs;
  int exact_exponent;
  BigUnsigned<84> exact_mantissa;
  int in_stack_fffffffffffffbcc;
  BigUnsigned<84> *in_stack_fffffffffffffbd0;
  BigUnsigned<84> *in_stack_fffffffffffffbd8;
  BigUnsigned<84> *in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbe8;
  int in_stack_fffffffffffffbec;
  undefined4 in_stack_fffffffffffffbf0;
  int in_stack_fffffffffffffbf4;
  undefined4 local_184;
  undefined1 local_1;
  
  strings_internal::BigUnsigned<84>::BigUnsigned((BigUnsigned<84> *)0x3aa84b);
  iVar1 = strings_internal::BigUnsigned<84>::ReadFloatMantissa
                    (in_stack_fffffffffffffbd8,(ParsedFloat *)in_stack_fffffffffffffbd0,
                     in_stack_fffffffffffffbcc);
  if (iVar1 < 0) {
    strings_internal::BigUnsigned<84>::FiveToTheNth(in_stack_fffffffffffffbf4);
    strings_internal::BigUnsigned<84>::MultiplyBy
              (in_stack_fffffffffffffbe0,(uint64_t)in_stack_fffffffffffffbd8);
    if (in_ESI + -1 < iVar1) {
      strings_internal::BigUnsigned<84>::ShiftLeft
                ((BigUnsigned<84> *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                 in_stack_fffffffffffffbec);
    }
    else {
      strings_internal::BigUnsigned<84>::ShiftLeft
                ((BigUnsigned<84> *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                 in_stack_fffffffffffffbec);
    }
    local_184 = strings_internal::Compare<84,84>
                          ((BigUnsigned<84> *)
                           CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                           in_stack_fffffffffffffbe0);
  }
  else {
    strings_internal::BigUnsigned<84>::MultiplyByFiveToTheNth
              (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbcc);
    strings_internal::BigUnsigned<84>::BigUnsigned
              (in_stack_fffffffffffffbe0,(uint64_t)in_stack_fffffffffffffbd8);
    if (in_ESI + -1 < iVar1) {
      strings_internal::BigUnsigned<84>::ShiftLeft
                ((BigUnsigned<84> *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                 in_stack_fffffffffffffbec);
    }
    else {
      strings_internal::BigUnsigned<84>::ShiftLeft
                ((BigUnsigned<84> *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                 in_stack_fffffffffffffbec);
    }
    local_184 = strings_internal::Compare<84,84>
                          ((BigUnsigned<84> *)
                           CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                           in_stack_fffffffffffffbe0);
  }
  if (local_184 < 0) {
    local_1 = false;
  }
  else if (local_184 < 1) {
    local_1 = (in_RDI * 2 + 1U & 2) == 2;
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool MustRoundUp(uint64_t guess_mantissa, int guess_exponent,
                 const strings_internal::ParsedFloat& parsed_decimal) {
  // 768 is the number of digits needed in the worst case.  We could determine a
  // better limit dynamically based on the value of parsed_decimal.exponent.
  // This would optimize pathological input cases only.  (Sane inputs won't have
  // hundreds of digits of mantissa.)
  absl::strings_internal::BigUnsigned<84> exact_mantissa;
  int exact_exponent = exact_mantissa.ReadFloatMantissa(parsed_decimal, 768);

  // Adjust the `guess` arguments to be halfway between A and B.
  guess_mantissa = guess_mantissa * 2 + 1;
  guess_exponent -= 1;

  // In our comparison:
  // lhs = exact = exact_mantissa * 10**exact_exponent
  //             = exact_mantissa * 5**exact_exponent * 2**exact_exponent
  // rhs = guess = guess_mantissa * 2**guess_exponent
  //
  // Because we are doing integer math, we can't directly deal with negative
  // exponents.  We instead move these to the other side of the inequality.
  absl::strings_internal::BigUnsigned<84>& lhs = exact_mantissa;
  int comparison;
  if (exact_exponent >= 0) {
    lhs.MultiplyByFiveToTheNth(exact_exponent);
    absl::strings_internal::BigUnsigned<84> rhs(guess_mantissa);
    // There are powers of 2 on both sides of the inequality; reduce this to
    // a single bit-shift.
    if (exact_exponent > guess_exponent) {
      lhs.ShiftLeft(exact_exponent - guess_exponent);
    } else {
      rhs.ShiftLeft(guess_exponent - exact_exponent);
    }
    comparison = Compare(lhs, rhs);
  } else {
    // Move the power of 5 to the other side of the equation, giving us:
    // lhs = exact_mantissa * 2**exact_exponent
    // rhs = guess_mantissa * 5**(-exact_exponent) * 2**guess_exponent
    absl::strings_internal::BigUnsigned<84> rhs =
        absl::strings_internal::BigUnsigned<84>::FiveToTheNth(-exact_exponent);
    rhs.MultiplyBy(guess_mantissa);
    if (exact_exponent > guess_exponent) {
      lhs.ShiftLeft(exact_exponent - guess_exponent);
    } else {
      rhs.ShiftLeft(guess_exponent - exact_exponent);
    }
    comparison = Compare(lhs, rhs);
  }
  if (comparison < 0) {
    return false;
  } else if (comparison > 0) {
    return true;
  } else {
    // When lhs == rhs, the decimal input is exactly between A and B.
    // Round towards even -- round up only if the low bit of the initial
    // `guess_mantissa` was a 1.  We shifted guess_mantissa left 1 bit at
    // the beginning of this function, so test the 2nd bit here.
    return (guess_mantissa & 2) == 2;
  }
}